

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

bool __thiscall
GdlGlyphClassDefn::CheckRecursiveGlyphClasses
          (GdlGlyphClassDefn *this,
          vector<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_> *vpglfcStack)

{
  pointer *pppGVar1;
  pointer ppGVar2;
  pointer ppGVar3;
  pointer ppGVar4;
  int iVar5;
  long lVar6;
  pointer ppGVar7;
  GdlGlyphClassDefn *local_68;
  string local_60;
  string local_40;
  
  ppGVar3 = (vpglfcStack->
            super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar6 = 0;
  while ((long)(vpglfcStack->
               super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>).
               _M_impl.super__Vector_impl_data._M_finish - (long)ppGVar3 >> 3 != lVar6) {
    ppGVar2 = ppGVar3 + lVar6;
    lVar6 = lVar6 + 1;
    if (*ppGVar2 == this) {
      return false;
    }
  }
  local_68 = this;
  std::vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>>::
  emplace_back<GdlGlyphClassDefn*>
            ((vector<GdlGlyphClassDefn*,std::allocator<GdlGlyphClassDefn*>> *)vpglfcStack,&local_68)
  ;
  ppGVar7 = (this->m_vpglfdMembers).
            super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppGVar4 = (this->m_vpglfdMembers).
            super__Vector_base<GdlGlyphClassMember_*,_std::allocator<GdlGlyphClassMember_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppGVar7 == ppGVar4) {
      pppGVar1 = &(vpglfcStack->
                  super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppGVar1 = *pppGVar1 + -1;
      return true;
    }
    iVar5 = (*((*ppGVar7)->super_GdlDefn)._vptr_GdlDefn[2])(*ppGVar7,vpglfcStack);
    ppGVar7 = ppGVar7 + 1;
  } while ((char)iVar5 != '\0');
  std::__cxx11::string::string
            ((string *)&local_40,"Recursive class definition: ",(allocator *)&local_68);
  std::__cxx11::string::string((string *)&local_60,(string *)&this->m_staName);
  GrcErrorList::AddError
            (&g_errorList,0x1034,&(this->super_GdlGlyphClassMember).super_GdlDefn.super_GdlObject,
             &local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  return false;
}

Assistant:

bool GdlGlyphClassDefn::CheckRecursiveGlyphClasses(std::vector<GdlGlyphClassDefn*> & vpglfcStack)
{
	for (size_t iglfd = 0; iglfd < vpglfcStack.size(); iglfd++)
	{
		if (vpglfcStack[iglfd] == this)
			return false;
	}

	vpglfcStack.push_back(this);
	for (auto const pglfd: m_vpglfdMembers)
	{
		if (!pglfd->CheckRecursiveGlyphClasses(vpglfcStack))
		{
			g_errorList.AddError(4148, this, "Recursive class definition: ", this->Name());
			return false;
		}
	}
	vpglfcStack.pop_back();

	return true;
}